

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O0

IConnection * __thiscall tonk::P2PConnectionKeyMap::FindByKey(P2PConnectionKeyMap *this,key_t key)

{
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *this_00;
  node *pnVar1;
  long in_RDI;
  IConnection *connection;
  Locker locker;
  int index;
  Lock *in_stack_ffffffffffffff88;
  IConnection *pIVar2;
  Locker *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_34 [12];
  RefCounter *local_28;
  uint local_1c;
  undefined1 *local_18;
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *local_10;
  IConnection *local_8;
  
  Locker::Locker(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = (LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *)(in_RDI + 0x30);
  local_18 = local_34;
  local_10 = this_00;
  local_1c = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::find_index
                       ((LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (uint *)this_00);
  if ((int)local_1c < 0) {
    local_8 = (IConnection *)0x0;
  }
  else {
    pnVar1 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::get_node
                       (this_00,local_1c);
    local_8 = (pnVar1->super_value_type).second;
  }
  pIVar2 = local_8;
  if (local_8 != (IConnection *)0x0) {
    local_28 = &local_8->SelfRefCount;
    std::__atomic_base<int>::operator++(&(local_8->SelfRefCount).RefCount.super___atomic_base<int>);
  }
  Locker::~Locker((Locker *)0x18494f);
  return pIVar2;
}

Assistant:

IConnection* FindByKey(key_t key)
    {
        Locker locker(P2PKeyLock);
        IConnection* connection = P2PKeyMap.Find(key);
        if (connection) {
            connection->SelfRefCount.IncrementReferences();
        }
        return connection;
    }